

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

int __thiscall sf::Image::copy(Image *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  pointer puVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint in_EAX;
  int k_1;
  void *pvVar6;
  int in_ECX;
  pointer __dest;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int *in_R8;
  long lVar10;
  ulong uVar11;
  long lVar12;
  char in_R9B;
  long lVar13;
  uchar uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int k;
  long lVar18;
  int iVar19;
  void *__src;
  bool bVar20;
  
  uVar16 = *(uint *)dst;
  if ((long)(int)uVar16 != 0) {
    iVar8 = *(int *)(dst + 4);
    in_EAX = (this->m_size).x;
    pvVar6 = (void *)(ulong)in_EAX;
    if ((in_EAX != 0 && iVar8 != 0) && (uVar3 = (this->m_size).y, uVar3 != 0)) {
      uVar17 = in_R8[2];
      iVar4 = in_R8[3];
      iVar15 = 0;
      if (iVar4 == 0 || uVar17 == 0) {
        iVar19 = 0;
        uVar17 = uVar16;
      }
      else {
        iVar15 = *in_R8;
        if (*in_R8 < 1) {
          iVar15 = 0;
        }
        iVar19 = 0;
        if (0 < in_R8[1]) {
          iVar19 = in_R8[1];
        }
        if ((int)uVar16 <= (int)uVar17) {
          uVar17 = uVar16;
        }
        if (iVar4 < iVar8) {
          iVar8 = iVar4;
        }
      }
      iVar4 = (int)src;
      uVar5 = in_EAX - iVar4;
      if (uVar17 + iVar4 <= in_EAX) {
        uVar5 = uVar17;
      }
      iVar7 = uVar3 - in_ECX;
      if ((uint)(iVar8 + in_ECX) <= uVar3) {
        iVar7 = iVar8;
      }
      if ((uVar5 != 0) && (iVar7 != 0)) {
        lVar13 = (long)(int)in_EAX;
        lVar10 = (long)(int)uVar16 * 4;
        __src = (void *)((ulong)((iVar19 * uVar16 + iVar15) * 4) + *(long *)(dst + 8));
        __dest = (this->m_pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + (in_ECX * in_EAX + iVar4) * 4;
        if (in_R9B == '\0') {
          while( true ) {
            in_EAX = (uint)pvVar6;
            bVar20 = iVar7 == 0;
            iVar7 = iVar7 + -1;
            if (bVar20) break;
            pvVar6 = memcpy(__dest,__src,(ulong)uVar5 << 2);
            __src = (void *)((long)__src + lVar10);
            __dest = __dest + lVar13 * 4;
          }
        }
        else {
          for (iVar8 = 0; in_EAX = (uint)pvVar6, iVar8 != iVar7; iVar8 = iVar8 + 1) {
            for (uVar9 = 0; uVar9 != uVar5; uVar9 = uVar9 + 1) {
              uVar11 = (ulong)(uint)((int)uVar9 * 4);
              puVar1 = __dest + uVar11;
              lVar12 = uVar11 + (long)__src;
              uVar11 = (ulong)(uint)((int)uVar9 * 4);
              bVar2 = *(byte *)((long)__src + uVar11 + 3);
              uVar16 = ((uint)__dest[uVar11 + 3] * (uint)bVar2) / 0xff;
              pvVar6 = (void *)(ulong)(ushort)uVar16;
              uVar16 = ((uint)__dest[uVar11 + 3] + (uint)bVar2) - uVar16;
              uVar14 = (uchar)uVar16;
              __dest[uVar11 + 3] = uVar14;
              if (uVar14 == '\0') {
                for (pvVar6 = (void *)0x0; pvVar6 != (void *)0x3;
                    pvVar6 = (void *)((long)pvVar6 + 1)) {
                  puVar1[(long)pvVar6] = *(uchar *)(lVar12 + (long)pvVar6);
                }
              }
              else {
                uVar16 = uVar16 & 0xff;
                for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
                  pvVar6 = (void *)((long)(int)((uint)puVar1[lVar18] * (uVar16 - bVar2) +
                                               (uint)*(byte *)(lVar12 + lVar18) * (uint)bVar2) /
                                    (long)(int)uVar16 & 0xffffffff);
                  puVar1[lVar18] = (uchar)pvVar6;
                }
              }
            }
            __src = (void *)((long)__src + lVar10);
            __dest = __dest + lVar13 * 4;
          }
        }
      }
    }
  }
  return in_EAX;
}

Assistant:

void Image::copy(const Image& source, unsigned int destX, unsigned int destY, const IntRect& sourceRect, bool applyAlpha)
{
    // Make sure that both images are valid
    if ((source.m_size.x == 0) || (source.m_size.y == 0) || (m_size.x == 0) || (m_size.y == 0))
        return;

    // Adjust the source rectangle
    IntRect srcRect = sourceRect;
    if (srcRect.width == 0 || (srcRect.height == 0))
    {
        srcRect.left   = 0;
        srcRect.top    = 0;
        srcRect.width  = static_cast<int>(source.m_size.x);
        srcRect.height = static_cast<int>(source.m_size.y);
    }
    else
    {
        if (srcRect.left   < 0) srcRect.left = 0;
        if (srcRect.top    < 0) srcRect.top  = 0;
        if (srcRect.width  > static_cast<int>(source.m_size.x)) srcRect.width  = static_cast<int>(source.m_size.x);
        if (srcRect.height > static_cast<int>(source.m_size.y)) srcRect.height = static_cast<int>(source.m_size.y);
    }

    // Then find the valid bounds of the destination rectangle
    unsigned int width  = static_cast<unsigned int>(srcRect.width);
    unsigned int height = static_cast<unsigned int>(srcRect.height);
    if (destX + width  > m_size.x) width  = m_size.x - destX;
    if (destY + height > m_size.y) height = m_size.y - destY;

    // Make sure the destination area is valid
    if ((width <= 0) || (height <= 0))
        return;

    // Precompute as much as possible
    std::size_t  pitch     = static_cast<std::size_t>(width) * 4;
    unsigned int rows      = height;
    int          srcStride = static_cast<int>(source.m_size.x) * 4;
    int          dstStride = static_cast<int>(m_size.x) * 4;
    const Uint8* srcPixels = &source.m_pixels[0] + (static_cast<unsigned int>(srcRect.left) + static_cast<unsigned int>(srcRect.top) * source.m_size.x) * 4;
    Uint8*       dstPixels = &m_pixels[0] + (destX + destY * m_size.x) * 4;

    // Copy the pixels
    if (applyAlpha)
    {
        // Interpolation using alpha values, pixel by pixel (slower)
        for (unsigned int i = 0; i < rows; ++i)
        {
            for (unsigned int j = 0; j < width; ++j)
            {
                // Get a direct pointer to the components of the current pixel
                const Uint8* src = srcPixels + j * 4;
                Uint8*       dst = dstPixels + j * 4;

                // Interpolate RGBA components using the alpha values of the destination and source pixels
                Uint8 src_alpha = src[3];
                Uint8 dst_alpha = dst[3];
                Uint8 out_alpha = static_cast<Uint8>(src_alpha + dst_alpha - src_alpha * dst_alpha / 255);

                dst[3] = out_alpha;

                if (out_alpha)
                    for (int k = 0; k < 3; k++)
                        dst[k] = static_cast<Uint8>((src[k] * src_alpha + dst[k] * (out_alpha - src_alpha)) / out_alpha);
                else
                    for (int k = 0; k < 3; k++)
                        dst[k] = src[k];
            }

            srcPixels += srcStride;
            dstPixels += dstStride;
        }
    }
    else
    {
        // Optimized copy ignoring alpha values, row by row (faster)
        for (unsigned int i = 0; i < rows; ++i)
        {
            std::memcpy(dstPixels, srcPixels, pitch);
            srcPixels += srcStride;
            dstPixels += dstStride;
        }
    }
}